

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

ON_ClassArray<ON_FontFaceQuartet> * __thiscall ON_FontList::QuartetList(ON_FontList *this)

{
  Member MVar1;
  Member aaMVar2 [2] [2];
  bool bVar3;
  Weight WVar4;
  Weight WVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ON_Font **ppOVar11;
  ulong uVar12;
  ON_Font *pOVar13;
  wchar_t *quartet_name_00;
  ON_3udex OVar14;
  uint local_ba0;
  ON_Font *local_b68;
  uint local_b28;
  ON_Font *local_b10;
  ON_Font *local_b00;
  ON_Font *local_af0;
  ON_Font *local_ae0;
  undefined1 local_a60 [8];
  ON_FontFaceQuartet q;
  undefined1 local_a30 [8];
  ON_FontFaceQuartet installed_font_quartet;
  ON_Font *installed_font;
  int local_9f0;
  int jj_1;
  int ii_1;
  Member fm_2;
  ON_Font *cleanf;
  uint local_9cc;
  uint uStack_9c8;
  ON_3udex ssw_dex_1;
  uint j_5;
  Member fm_1;
  uint j_4;
  int iStack_9ac;
  Member m;
  int jj;
  int ii;
  Member member [2] [2];
  uint j_3;
  uint j_2;
  uint bold_dex;
  uint regular_dex;
  int j_1;
  int pair_dex;
  uint slant_dex_1;
  uint bold_weight_dex;
  uint medium_weight_dex;
  uint normal_weight_dex;
  uint k1;
  uint k0;
  uint k;
  uint stretch_dex_1;
  uint bolditalic_count;
  uint italic_count;
  uint bold_count;
  uint regular_count;
  bool bHaveQuartetFaces;
  ON_Font *quartet_faces [2] [2];
  uint weight_dex;
  uint slant_dex;
  uint stretch_dex;
  uint local_910;
  uint uStack_90c;
  ON_3udex ssw_dex;
  uint uStack_8fc;
  Member fm;
  uint j;
  uint pass;
  uint local_8ec;
  ON_Font *pOStack_8e8;
  uint pass_count;
  ON_Font *slanted_faces [2];
  ON_Font *upright_faces [2];
  uint local_8bc;
  uint local_8b8;
  uint slanted_face_count;
  uint upright_face_count;
  uint decorated_fonts_count;
  uint fonts_by_ssw_count;
  ON_wString quartet_name;
  uint i;
  uint next_i;
  ON_SimpleArray<const_ON_Font_*> bolditalic_faces;
  ON_SimpleArray<const_ON_Font_*> italic_faces;
  undefined1 local_858 [8];
  ON_SimpleArray<const_ON_Font_*> bold_faces;
  ON_SimpleArray<const_ON_Font_*> regular_faces;
  uint uStack_820;
  uint medium_stretch_dex;
  uint stretch_dex_range [2];
  uint weight_count [10] [2];
  ON_Font *fonts_by_ssw [11] [2] [11];
  uint max_weight_dex;
  uint max_stretch_dex;
  ON_Font *f;
  ON_SimpleArray<const_ON_Font_*> *pOStack_20;
  uint font_count;
  ON_SimpleArray<const_ON_Font_*> *a;
  ON_FontList *this_local;
  
  a = (ON_SimpleArray<const_ON_Font_*> *)this;
  pOStack_20 = ByQuartetName(this);
  iVar6 = ON_ClassArray<ON_FontFaceQuartet>::Count(&this->m_quartet_list);
  if (iVar6 < 1) {
    f._4_4_ = ON_SimpleArray<const_ON_Font_*>::UnsignedCount(pOStack_20);
    ON_ClassArray<ON_FontFaceQuartet>::Reserve(&this->m_quartet_list,(ulong)((f._4_4_ >> 2) + 0x20))
    ;
    _max_weight_dex = (ON_Font *)0x0;
    fonts_by_ssw[10][1][10]._4_4_ = 10;
    fonts_by_ssw[10][1][10]._0_4_ = 10;
    memset(weight_count + 9,0,0x790);
    weight_count[7][0] = 0;
    weight_count[7][1] = 0;
    weight_count[8][0] = 0;
    weight_count[8][1] = 0;
    weight_count[5][0] = 0;
    weight_count[5][1] = 0;
    weight_count[6][0] = 0;
    weight_count[6][1] = 0;
    weight_count[3][0] = 0;
    weight_count[3][1] = 0;
    weight_count[4][0] = 0;
    weight_count[4][1] = 0;
    weight_count[1][0] = 0;
    weight_count[1][1] = 0;
    weight_count[2][0] = 0;
    weight_count[2][1] = 0;
    weight_count[0][0] = 0;
    weight_count[0][1] = 0;
    ON_SimpleArray<const_ON_Font_*>::ON_SimpleArray
              ((ON_SimpleArray<const_ON_Font_*> *)&bold_faces.m_count,8);
    ON_SimpleArray<const_ON_Font_*>::ON_SimpleArray((ON_SimpleArray<const_ON_Font_*> *)local_858,8);
    ON_SimpleArray<const_ON_Font_*>::ON_SimpleArray
              ((ON_SimpleArray<const_ON_Font_*> *)&bolditalic_faces.m_count,8);
    ON_SimpleArray<const_ON_Font_*>::ON_SimpleArray((ON_SimpleArray<const_ON_Font_*> *)&i,8);
    quartet_name.m_s._4_4_ = 0;
    quartet_name.m_s._0_4_ = 0;
    while ((uint)quartet_name.m_s < f._4_4_) {
      ppOVar11 = ON_SimpleArray<const_ON_Font_*>::operator[](pOStack_20,(uint)quartet_name.m_s);
      _max_weight_dex = *ppOVar11;
      if (_max_weight_dex != (ON_Font *)0x0) {
        ON_Font::QuartetName((ON_Font *)&fonts_by_ssw_count);
        bVar3 = ON_wString::IsEmpty((ON_wString *)&fonts_by_ssw_count);
        if (!bVar3) {
          upright_face_count = 0;
          slanted_face_count = 0;
          memset(weight_count + 9,0,0x790);
          weight_count[7][0] = 0;
          weight_count[7][1] = 0;
          weight_count[8][0] = 0;
          weight_count[8][1] = 0;
          weight_count[5][0] = 0;
          weight_count[5][1] = 0;
          weight_count[6][0] = 0;
          weight_count[6][1] = 0;
          weight_count[3][0] = 0;
          weight_count[3][1] = 0;
          weight_count[4][0] = 0;
          weight_count[4][1] = 0;
          weight_count[1][0] = 0;
          weight_count[1][1] = 0;
          weight_count[2][0] = 0;
          weight_count[2][1] = 0;
          weight_count[0][0] = 0;
          weight_count[0][1] = 0;
          _uStack_820 = 0.0;
          ON_SimpleArray<const_ON_Font_*>::SetCount
                    ((ON_SimpleArray<const_ON_Font_*> *)&bold_faces.m_count,0);
          ON_SimpleArray<const_ON_Font_*>::SetCount((ON_SimpleArray<const_ON_Font_*> *)local_858,0);
          ON_SimpleArray<const_ON_Font_*>::SetCount
                    ((ON_SimpleArray<const_ON_Font_*> *)&bolditalic_faces.m_count,0);
          ON_SimpleArray<const_ON_Font_*>::SetCount((ON_SimpleArray<const_ON_Font_*> *)&i,0);
          local_8b8 = 0;
          local_8bc = 0;
          memset(slanted_faces + 1,0,0x10);
          memset(&stack0xfffffffffffff718,0,0x10);
          local_8ec = 1;
          for (quartet_name.m_s._4_4_ = (uint)quartet_name.m_s; quartet_name.m_s._4_4_ < f._4_4_;
              quartet_name.m_s._4_4_ = quartet_name.m_s._4_4_ + 1) {
            ppOVar11 = ON_SimpleArray<const_ON_Font_*>::operator[]
                                 (pOStack_20,quartet_name.m_s._4_4_);
            _max_weight_dex = *ppOVar11;
            if (_max_weight_dex == (ON_Font *)0x0) break;
            ON_Font::QuartetName((ON_Font *)&j);
            bVar3 = ON_wString::EqualOrdinal
                              ((ON_wString *)&fonts_by_ssw_count,(ON_wString *)&j,true);
            ON_wString::~ON_wString((ON_wString *)&j);
            if (!bVar3) break;
            bVar3 = ON_Font::IsManagedSubstitutedFont(_max_weight_dex);
            if (bVar3) {
              local_8ec = 2;
            }
          }
          for (uStack_8fc = 0; uStack_8fc < local_8ec; uStack_8fc = uStack_8fc + 1) {
            for (ssw_dex.k = (uint)quartet_name.m_s; ssw_dex.k < quartet_name.m_s._4_4_;
                ssw_dex.k = ssw_dex.k + 1) {
              ppOVar11 = ON_SimpleArray<const_ON_Font_*>::operator[](pOStack_20,ssw_dex.k);
              _max_weight_dex = *ppOVar11;
              if (_max_weight_dex != (ON_Font *)0x0) {
                bVar3 = ON_Font::IsUnderlined(_max_weight_dex);
                if ((bVar3) || (bVar3 = ON_Font::IsStrikethrough(_max_weight_dex), bVar3)) {
                  slanted_face_count = slanted_face_count + 1;
                }
                else {
                  bVar3 = ON_Font::IsManagedSubstitutedFont(_max_weight_dex);
                  if (uStack_8fc == bVar3) {
                    MVar1 = _max_weight_dex->m_quartet_member;
                    OVar14 = Internal_StretchSlantWeightDex(10,10,_max_weight_dex);
                    uVar7 = OVar14.k;
                    uVar12 = OVar14._0_8_;
                    local_910 = OVar14.i;
                    if ((((local_910 != 0) && (local_910 < 10)) &&
                        (uStack_90c = OVar14.j, uVar7 != 0)) &&
                       ((uVar7 < 10 &&
                        (fonts_by_ssw[(uVar12 & 0xffffffff) - 1][(ulong)uStack_90c + 1]
                         [(ulong)uVar7 + 10] == (ON_Font *)0x0)))) {
                      upright_face_count = upright_face_count + 1;
                      fonts_by_ssw[(uVar12 & 0xffffffff) - 1][(ulong)uStack_90c + 1]
                      [(ulong)uVar7 + 10] = _max_weight_dex;
                      if (upright_face_count == 1) {
                        _uStack_820 = (double)CONCAT44(local_910,local_910);
                      }
                      else if (local_910 < uStack_820) {
                        _uStack_820 = (double)CONCAT44(medium_stretch_dex,local_910);
                      }
                      else if (medium_stretch_dex < local_910) {
                        _uStack_820 = (double)CONCAT44(local_910,uStack_820);
                      }
                      weight_count[(uVar12 & 0xffffffff) - 1][uStack_90c] =
                           weight_count[(uVar12 & 0xffffffff) - 1][uStack_90c] + 1;
                      if (uStack_90c == 0) {
                        if (local_8b8 < 2) {
                          slanted_faces[(ulong)local_8b8 + 1] = _max_weight_dex;
                        }
                        local_8b8 = local_8b8 + 1;
                      }
                      else if (uStack_90c == 1) {
                        if (local_8bc < 2) {
                          upright_faces[(ulong)local_8bc - 3] = _max_weight_dex;
                        }
                        local_8bc = local_8bc + 1;
                      }
                      switch(MVar1) {
                      case Unset:
                        break;
                      case Regular:
                        ON_SimpleArray<const_ON_Font_*>::Append
                                  ((ON_SimpleArray<const_ON_Font_*> *)&bold_faces.m_count,
                                   (ON_Font **)&max_weight_dex);
                        break;
                      case Bold:
                        ON_SimpleArray<const_ON_Font_*>::Append
                                  ((ON_SimpleArray<const_ON_Font_*> *)local_858,
                                   (ON_Font **)&max_weight_dex);
                        break;
                      case Italic:
                        ON_SimpleArray<const_ON_Font_*>::Append
                                  ((ON_SimpleArray<const_ON_Font_*> *)&bolditalic_faces.m_count,
                                   (ON_Font **)&max_weight_dex);
                        break;
                      case BoldItalic:
                        ON_SimpleArray<const_ON_Font_*>::Append
                                  ((ON_SimpleArray<const_ON_Font_*> *)&i,(ON_Font **)&max_weight_dex
                                  );
                      }
                    }
                  }
                }
              }
            }
          }
          if (upright_face_count != 0) {
            quartet_faces[0][1] = (ON_Font *)0x0;
            quartet_faces[1][0] = (ON_Font *)0x0;
            _regular_count = (ON_Font *)0x0;
            quartet_faces[0][0] = (ON_Font *)0x0;
            bVar3 = false;
            uVar7 = ON_SimpleArray<const_ON_Font_*>::UnsignedCount
                              ((ON_SimpleArray<const_ON_Font_*> *)&bold_faces.m_count);
            uVar8 = ON_SimpleArray<const_ON_Font_*>::UnsignedCount
                              ((ON_SimpleArray<const_ON_Font_*> *)local_858);
            uVar9 = ON_SimpleArray<const_ON_Font_*>::UnsignedCount
                              ((ON_SimpleArray<const_ON_Font_*> *)&bolditalic_faces.m_count);
            uVar10 = ON_SimpleArray<const_ON_Font_*>::UnsignedCount
                               ((ON_SimpleArray<const_ON_Font_*> *)&i);
            if (((upright_face_count == uVar7 + uVar8 + uVar9 + uVar10) && (uVar7 < 2)) &&
               ((uVar8 < 2 && ((uVar9 < 2 && (uVar10 < 2)))))) {
              if (uVar7 == 1) {
                ppOVar11 = ON_SimpleArray<const_ON_Font_*>::operator[]
                                     ((ON_SimpleArray<const_ON_Font_*> *)&bold_faces.m_count,0);
                local_ae0 = *ppOVar11;
              }
              else {
                local_ae0 = (ON_Font *)0x0;
              }
              _regular_count = local_ae0;
              if (uVar8 == 1) {
                ppOVar11 = ON_SimpleArray<const_ON_Font_*>::operator[]
                                     ((ON_SimpleArray<const_ON_Font_*> *)local_858,0);
                local_af0 = *ppOVar11;
              }
              else {
                local_af0 = (ON_Font *)0x0;
              }
              quartet_faces[0][0] = local_af0;
              if (uVar9 == 1) {
                ppOVar11 = ON_SimpleArray<const_ON_Font_*>::operator[]
                                     ((ON_SimpleArray<const_ON_Font_*> *)&bolditalic_faces.m_count,0
                                     );
                local_b00 = *ppOVar11;
              }
              else {
                local_b00 = (ON_Font *)0x0;
              }
              quartet_faces[0][1] = local_b00;
              if (uVar10 == 1) {
                ppOVar11 = ON_SimpleArray<const_ON_Font_*>::operator[]
                                     ((ON_SimpleArray<const_ON_Font_*> *)&i,0);
                local_b10 = *ppOVar11;
              }
              else {
                local_b10 = (ON_Font *)0x0;
              }
              quartet_faces[1][0] = local_b10;
              bVar3 = true;
            }
            else if ((upright_face_count == local_8b8 + local_8bc) &&
                    (((local_8b8 < 3 && (local_8bc < 3)) && (uStack_820 == medium_stretch_dex)))) {
              if (local_8b8 == 2) {
                WVar4 = ON_Font::FontWeight(slanted_faces[1]);
                WVar5 = ON_Font::FontWeight(upright_faces[0]);
                iVar6 = ON_Font::CompareWeight(WVar4,WVar5);
                pOVar13 = slanted_faces[1];
                if (0 < iVar6) {
                  _max_weight_dex = slanted_faces[1];
                  slanted_faces[1] = upright_faces[0];
                  upright_faces[0] = pOVar13;
                }
              }
              if (local_8bc == 2) {
                WVar4 = ON_Font::FontWeight(pOStack_8e8);
                WVar5 = ON_Font::FontWeight(slanted_faces[0]);
                iVar6 = ON_Font::CompareWeight(WVar4,WVar5);
                pOVar13 = pOStack_8e8;
                if (0 < iVar6) {
                  _max_weight_dex = pOStack_8e8;
                  pOStack_8e8 = slanted_faces[0];
                  slanted_faces[0] = pOVar13;
                }
              }
              _regular_count = slanted_faces[1];
              quartet_faces[0][0] = upright_faces[0];
              quartet_faces[0][1] = pOStack_8e8;
              quartet_faces[1][0] = slanted_faces[0];
              bVar3 = true;
            }
            if (!bVar3) {
              k0 = 5;
              if (uStack_820 < medium_stretch_dex) {
                for (k1 = 1; k1 < 6; k1 = k1 + 1) {
                  uVar7 = 5 - k1;
                  uVar8 = k1 + 5;
                  if ((uVar7 != 0) &&
                     (weight_count[(ulong)k0 - 1][0] + weight_count[(ulong)k0 - 1][1] <
                      weight_count[(ulong)uVar7 - 1][0] + weight_count[(ulong)uVar7 - 1][1])) {
                    k0 = uVar7;
                  }
                  if ((uVar8 < 10) &&
                     (weight_count[(ulong)k0 - 1][0] + weight_count[(ulong)k0 - 1][1] <
                      weight_count[(ulong)uVar8 - 1][0] + weight_count[(ulong)uVar8 - 1][1])) {
                    k0 = uVar8;
                  }
                }
              }
              else {
                k0 = uStack_820;
              }
              if (((k0 == 0) || (9 < k0)) ||
                 (weight_count[(ulong)k0 - 1][0] + weight_count[(ulong)k0 - 1][1] == 0))
              goto LAB_0062c0d0;
              for (j_1 = 0; (uint)j_1 < 2; j_1 = j_1 + 1) {
                if (weight_count[(ulong)k0 - 1][(uint)j_1] < 3) {
                  regular_dex = 0;
                  for (bold_dex = 1; bold_dex < 10 && (int)regular_dex < 2; bold_dex = bold_dex + 1)
                  {
                    if (fonts_by_ssw[(ulong)k0 - 1][(ulong)(uint)j_1 + 1][(long)(int)bold_dex + 10]
                        != (ON_Font *)0x0) {
                      *(ON_Font **)
                       (&regular_count + (ulong)(uint)j_1 * 4 + (long)(int)regular_dex * 2) =
                           fonts_by_ssw[(ulong)k0 - 1][(ulong)(uint)j_1 + 1]
                           [(long)(int)bold_dex + 10];
                      regular_dex = regular_dex + 1;
                    }
                  }
                }
                else {
                  j_2 = 5;
                  if (fonts_by_ssw[k0][(uint)j_1][3] != (ON_Font *)0x0) {
                    j_2 = 4;
                  }
                  for (; fonts_by_ssw[(ulong)k0 - 1][(ulong)(uint)j_1 + 1][(ulong)j_2 + 10] ==
                         (ON_Font *)0x0 && j_2 != 0; j_2 = j_2 - 1) {
                  }
                  if (fonts_by_ssw[k0][(uint)j_1][6] == (ON_Font *)0x0) {
                    local_b28 = j_2 + 1;
                  }
                  else {
                    local_b28 = 7;
                  }
                  for (j_3 = local_b28;
                      fonts_by_ssw[(ulong)k0 - 1][(ulong)(uint)j_1 + 1][(ulong)j_3 + 10] ==
                      (ON_Font *)0x0 && j_3 < 10; j_3 = j_3 + 1) {
                  }
                  if ((fonts_by_ssw[(ulong)k0 - 1][(ulong)(uint)j_1 + 1][(ulong)j_2 + 10] ==
                       (ON_Font *)0x0) ||
                     (fonts_by_ssw[(ulong)k0 - 1][(ulong)(uint)j_1 + 1][(ulong)j_3 + 10] !=
                      (ON_Font *)0x0)) {
                    if ((fonts_by_ssw[(ulong)k0 - 1][(ulong)(uint)j_1 + 1][(ulong)j_2 + 10] ==
                         (ON_Font *)0x0) &&
                       ((fonts_by_ssw[(ulong)k0 - 1][(ulong)(uint)j_1 + 1][(ulong)j_3 + 10] !=
                         (ON_Font *)0x0 && (uVar7 = j_3, j_3 != 0)))) {
                      do {
                        ii = uVar7 - 1;
                        if (ii == 0) goto LAB_0062b6e8;
                        uVar7 = ii;
                      } while (fonts_by_ssw[(ulong)k0 - 1][(ulong)(uint)j_1 + 1]
                               [(ulong)(uint)ii + 10] == (ON_Font *)0x0);
                      j_2 = ii;
                    }
                  }
                  else {
                    aaMVar2 = (Member  [2] [2])j_2;
                    if (j_2 != 0) {
                      do {
                        member = (Member  [2] [2])((int)aaMVar2 + -1);
                        if (member == (Member  [2] [2])0x0) goto LAB_0062b6e8;
                        aaMVar2 = member;
                      } while (fonts_by_ssw[(ulong)k0 - 1][(ulong)(uint)j_1 + 1]
                               [(ulong)(uint)member + 10] == (ON_Font *)0x0);
                      j_3 = j_2;
                      j_2 = (uint)member;
                    }
                  }
LAB_0062b6e8:
                  *(ON_Font **)(&regular_count + (ulong)(uint)j_1 * 4) =
                       fonts_by_ssw[(ulong)k0 - 1][(ulong)(uint)j_1 + 1][(ulong)j_2 + 10];
                  quartet_faces[(uint)j_1][0] =
                       fonts_by_ssw[(ulong)k0 - 1][(ulong)(uint)j_1 + 1][(ulong)j_3 + 10];
                }
              }
            }
            if ((_regular_count == (ON_Font *)0x0) && (quartet_faces[0][0] == (ON_Font *)0x0)) {
              _regular_count = quartet_faces[0][1];
              quartet_faces[0][0] = quartet_faces[1][0];
              quartet_faces[0][1] = (ON_Font *)0x0;
              quartet_faces[1][0] = (ON_Font *)0x0;
            }
            if ((_regular_count == (ON_Font *)0x0) && (quartet_faces[0][1] == (ON_Font *)0x0)) {
              _regular_count = quartet_faces[0][0];
              quartet_faces[0][1] = quartet_faces[1][0];
              quartet_faces[0][0] = (ON_Font *)0x0;
              quartet_faces[1][0] = (ON_Font *)0x0;
            }
            jj = 0x4030201;
            for (iStack_9ac = 0; iStack_9ac < 2; iStack_9ac = iStack_9ac + 1) {
              for (j_4 = 0; (int)j_4 < 2; j_4 = j_4 + 1) {
                _max_weight_dex =
                     *(ON_Font **)(&regular_count + (long)iStack_9ac * 4 + (long)(int)j_4 * 2);
                if (_max_weight_dex != (ON_Font *)0x0) {
                  if (_max_weight_dex->m_quartet_member == Unset) {
                    _max_weight_dex->m_quartet_member =
                         *(Member *)((long)&jj + (long)(int)j_4 + (long)iStack_9ac * 2);
                  }
                  else if ((_max_weight_dex->m_quartet_member !=
                            *(Member *)((long)&jj + (long)(int)j_4 + (long)iStack_9ac * 2)) &&
                          (_max_weight_dex->m_font_type != InstalledFont)) {
                    *(undefined1 *)
                     (*(long *)(&regular_count + (long)iStack_9ac * 4 + (long)(int)j_4 * 2) + 0x91)
                         = *(undefined1 *)((long)&jj + (long)(int)j_4 + (long)iStack_9ac * 2);
                  }
                }
              }
            }
            for (j_5 = (uint)quartet_name.m_s; j_5 < quartet_name.m_s._4_4_; j_5 = j_5 + 1) {
              ppOVar11 = ON_SimpleArray<const_ON_Font_*>::operator[](pOStack_20,j_5);
              _max_weight_dex = *ppOVar11;
              if ((((((_max_weight_dex != (ON_Font *)0x0) && (_max_weight_dex != _regular_count)) &&
                    (_max_weight_dex != quartet_faces[0][0])) &&
                   ((_max_weight_dex != quartet_faces[0][1] &&
                    (_max_weight_dex != quartet_faces[1][0])))) &&
                  (bVar3 = ON_Font::IsUnderlined(_max_weight_dex), !bVar3)) &&
                 (((bVar3 = ON_Font::IsStrikethrough(_max_weight_dex), !bVar3 &&
                   (_max_weight_dex->m_quartet_member != Unset)) &&
                  (_max_weight_dex->m_font_type == InstalledFont)))) {
                _max_weight_dex->m_quartet_member = Unset;
              }
            }
            if (slanted_face_count != 0) {
              for (ssw_dex_1.j = (uint)quartet_name.m_s; ssw_dex_1.j < quartet_name.m_s._4_4_;
                  ssw_dex_1.j = ssw_dex_1.j + 1) {
                ppOVar11 = ON_SimpleArray<const_ON_Font_*>::operator[](pOStack_20,ssw_dex_1.j);
                _max_weight_dex = *ppOVar11;
                if ((_max_weight_dex != (ON_Font *)0x0) &&
                   ((bVar3 = ON_Font::IsUnderlined(_max_weight_dex), bVar3 ||
                    (bVar3 = ON_Font::IsStrikethrough(_max_weight_dex), bVar3)))) {
                  OVar14 = Internal_StretchSlantWeightDex(10,10,_max_weight_dex);
                  uVar7 = OVar14.k;
                  local_9cc = OVar14.i;
                  if ((local_9cc == 0) ||
                     ((((9 < local_9cc || (uStack_9c8 = OVar14.j, 1 < uStack_9c8)) || (uVar7 == 0))
                      || (9 < uVar7)))) {
                    local_b68 = (ON_Font *)0x0;
                  }
                  else {
                    local_b68 = fonts_by_ssw[(OVar14._0_8_ & 0xffffffff) - 1][(ulong)uVar7 + 1]
                                [(ulong)uVar7 + 10];
                  }
                  if (local_b68 != (ON_Font *)0x0) {
                    _max_weight_dex->m_quartet_member = local_b68->m_quartet_member;
                  }
                }
              }
            }
            for (local_9f0 = 0; local_9f0 < 2; local_9f0 = local_9f0 + 1) {
              for (installed_font._4_4_ = 0; installed_font._4_4_ < 2;
                  installed_font._4_4_ = installed_font._4_4_ + 1) {
                _max_weight_dex =
                     *(ON_Font **)
                      (&regular_count + (long)local_9f0 * 4 + (long)installed_font._4_4_ * 2);
                if (((_max_weight_dex != (ON_Font *)0x0) &&
                    (_max_weight_dex->m_font_type != InstalledFont)) &&
                   ((((bVar3 = ON_Font::IsManagedSubstitutedFont(_max_weight_dex), !bVar3 &&
                      ((bVar3 = ON_Font::IsManagedFont(_max_weight_dex), bVar3 &&
                       (bVar3 = ON_Font::IsUnderlined(_max_weight_dex), !bVar3)))) &&
                     (bVar3 = ON_Font::IsStrikethrough(_max_weight_dex), !bVar3)) &&
                    ((pOVar13 = ON_Font::Internal_ManagedFontToInstalledFont(_max_weight_dex),
                     pOVar13 != (ON_Font *)0x0 && (bVar3 = ON_Font::IsInstalledFont(pOVar13), bVar3)
                     ))))) {
                  ON_Font::QuartetName((ON_Font *)&installed_font_quartet.m_bold_italic);
                  bVar3 = ON_wString::EqualOrdinal
                                    ((ON_wString *)&fonts_by_ssw_count,
                                     (ON_wString *)&installed_font_quartet.m_bold_italic,true);
                  ON_wString::~ON_wString((ON_wString *)&installed_font_quartet.m_bold_italic);
                  if (bVar3) {
                    ON_Font::InstalledFontQuartet((ON_FontFaceQuartet *)local_a30,pOVar13);
                    ON_FontFaceQuartet::QuartetName((ON_FontFaceQuartet *)&q.m_bold_italic);
                    bVar3 = ON_wString::EqualOrdinal
                                      ((ON_wString *)&fonts_by_ssw_count,
                                       (ON_wString *)&q.m_bold_italic,true);
                    ON_wString::~ON_wString((ON_wString *)&q.m_bold_italic);
                    if (bVar3) {
                      bVar3 = ON_FontFaceQuartet::HasRegularFace((ON_FontFaceQuartet *)local_a30);
                      if (bVar3) {
                        _regular_count =
                             ON_FontFaceQuartet::RegularFace((ON_FontFaceQuartet *)local_a30);
                      }
                      bVar3 = ON_FontFaceQuartet::HasBoldFace((ON_FontFaceQuartet *)local_a30);
                      if (bVar3) {
                        quartet_faces[0][0] =
                             ON_FontFaceQuartet::BoldFace((ON_FontFaceQuartet *)local_a30);
                      }
                      bVar3 = ON_FontFaceQuartet::HasItalicFace((ON_FontFaceQuartet *)local_a30);
                      if (bVar3) {
                        quartet_faces[0][1] =
                             ON_FontFaceQuartet::ItalicFace((ON_FontFaceQuartet *)local_a30);
                      }
                      bVar3 = ON_FontFaceQuartet::HasBoldItalicFace((ON_FontFaceQuartet *)local_a30)
                      ;
                      if (bVar3) {
                        quartet_faces[1][0] =
                             ON_FontFaceQuartet::BoldItalicFace((ON_FontFaceQuartet *)local_a30);
                      }
                    }
                    ON_FontFaceQuartet::~ON_FontFaceQuartet((ON_FontFaceQuartet *)local_a30);
                  }
                }
              }
            }
            quartet_name_00 =
                 ON_wString::operator_cast_to_wchar_t_((ON_wString *)&fonts_by_ssw_count);
            ON_FontFaceQuartet::ON_FontFaceQuartet
                      ((ON_FontFaceQuartet *)local_a60,quartet_name_00,_regular_count,
                       quartet_faces[0][0],quartet_faces[0][1],quartet_faces[1][0]);
            bVar3 = ON_FontFaceQuartet::IsEmpty((ON_FontFaceQuartet *)local_a60);
            if (!bVar3) {
              ON_ClassArray<ON_FontFaceQuartet>::Append
                        (&this->m_quartet_list,(ON_FontFaceQuartet *)local_a60);
            }
            ON_FontFaceQuartet::~ON_FontFaceQuartet((ON_FontFaceQuartet *)local_a60);
          }
        }
LAB_0062c0d0:
        ON_wString::~ON_wString((ON_wString *)&fonts_by_ssw_count);
      }
      if ((uint)quartet_name.m_s < quartet_name.m_s._4_4_) {
        local_ba0 = quartet_name.m_s._4_4_;
      }
      else {
        local_ba0 = (uint)quartet_name.m_s + 1;
      }
      quartet_name.m_s._0_4_ = local_ba0;
    }
    this_local = (ON_FontList *)&this->m_quartet_list;
    ON_SimpleArray<const_ON_Font_*>::~ON_SimpleArray((ON_SimpleArray<const_ON_Font_*> *)&i);
    ON_SimpleArray<const_ON_Font_*>::~ON_SimpleArray
              ((ON_SimpleArray<const_ON_Font_*> *)&bolditalic_faces.m_count);
    ON_SimpleArray<const_ON_Font_*>::~ON_SimpleArray((ON_SimpleArray<const_ON_Font_*> *)local_858);
    ON_SimpleArray<const_ON_Font_*>::~ON_SimpleArray
              ((ON_SimpleArray<const_ON_Font_*> *)&bold_faces.m_count);
  }
  else {
    this_local = (ON_FontList *)&this->m_quartet_list;
  }
  return (ON_ClassArray<ON_FontFaceQuartet> *)this_local;
}

Assistant:

const ON_ClassArray< ON_FontFaceQuartet >& ON_FontList::QuartetList() const
{
  // call ByQuartetName() first to insure m_quartet_list[] is set correctly.
  const ON_SimpleArray<const ON_Font*>& a = this->ByQuartetName();
  
  if (m_quartet_list.Count() > 0)
    return m_quartet_list;

  const unsigned int font_count = a.UnsignedCount();
  m_quartet_list.Reserve(32 + font_count / 4);

  const ON_Font* f = nullptr;
  const unsigned max_stretch_dex = 10;
  const unsigned max_weight_dex = 10;

  // fonts_by_ssw[stretch_dex][upright,italic][weight_dex]
  // = all fonts with the same quartet name arranged by stretch, slant, and weight.
  const ON_Font* fonts_by_ssw[11][2][11] = {};

  // weight_count[stretch_dex][upright,italic] = number of weights available for that stretch and slant
  unsigned int weight_count[10][2] = {};

  // stretch values range from min stretch = stretch_dex_range[0] to max stretch = stretch_dex_range[1].
  unsigned stretch_dex_range[2] = { 0U,0U };

  // Fonts with stretch < medium_stretch_dex are "compressed"
  // Fonts with stretch > medium_stretch_dex are "expanded"
  // When we have multiple candidates to choose from, we opt for ones closest to medium.
  const unsigned medium_stretch_dex = (unsigned)static_cast<unsigned char>(ON_Font::Stretch::Medium);

  ON_SimpleArray<const ON_Font*> regular_faces(8);
  ON_SimpleArray<const ON_Font*> bold_faces(8);
  ON_SimpleArray<const ON_Font*> italic_faces(8);
  ON_SimpleArray<const ON_Font*> bolditalic_faces(8);

  unsigned next_i = 0U;
  for (unsigned i = 0; i < font_count; i = (i < next_i) ? next_i : (i+1))
  {
    f = a[i];
    if (nullptr == f)
      continue;

    const ON_wString quartet_name = f->QuartetName();
    if (quartet_name.IsEmpty())
      continue;

    // fonts_by_ssw_count = total number of undecorated fonts with the same QuartetName()
    unsigned fonts_by_ssw_count = 0;

    // total number of fonts with underline or striketrough rendering effects enabled.
    unsigned decorated_fonts_count = 0;

    // fonts_by_ssw[][][] = all the "clean" fonts with the same quartet name sorted by stretch-slant-weight
    memset(fonts_by_ssw, 0, sizeof(fonts_by_ssw));
    memset(weight_count, 0, sizeof(weight_count));
    memset(stretch_dex_range, 0, sizeof(stretch_dex_range));
    regular_faces.SetCount(0);
    bold_faces.SetCount(0);
    italic_faces.SetCount(0);
    bolditalic_faces.SetCount(0);

    unsigned int upright_face_count = 0;
    unsigned int slanted_face_count = 0;
    const ON_Font* upright_faces[2] = {}; // room to save up to 2 upright faces
    const ON_Font* slanted_faces[2] = {}; // room to save up to 2 slanted faces

    // This for() loop sets the array limits for the fonts with the same quartet name
    // and determines how many passes are needed (substitutes are ignored in favor of
    // non substitutes).
    unsigned pass_count = 1;
    for (next_i = i; next_i < font_count; ++next_i)
    {
      f = a[next_i];
      if (nullptr == f)
        break;
      if (false == quartet_name.EqualOrdinal(f->QuartetName(), true))
        break; // f has a different quartet name - we're done getting the fonts in this quartet
      if (f->IsManagedSubstitutedFont())
        pass_count = 2;
    }
    
    // This for() loop gets all the fonts with the same QuartetName() and puts them in fonts_by_ssw[][][]. 
    // While doing that it get ranges of values stretch, counts the number of fonts that have each weight, ...
    for ( unsigned pass = 0; pass < pass_count; ++pass) for ( unsigned j = i; j < next_i; ++j)
    {
      f = a[j];
      if (nullptr == f)
        continue;
      if (f->IsUnderlined() || f->IsStrikethrough())
      {
        // these are rendering effects and we should have a "clean" version in this list too
        ++decorated_fonts_count;
        continue; 
      }
      if (pass != (f->IsManagedSubstitutedFont() ? 1U : 0U))
        continue;

      const ON_FontFaceQuartet::Member fm = f->m_quartet_member;

      // use f's stretch-slant-weight to add it to the fonts_by_ssw[][][] array.
      const ON_3udex ssw_dex = Internal_StretchSlantWeightDex(max_stretch_dex, max_weight_dex, f);

      const unsigned stretch_dex = ssw_dex.i;
      if (stretch_dex < 1 || stretch_dex >= max_stretch_dex)
        continue;

      const unsigned slant_dex = ssw_dex.j;

      const unsigned weight_dex = ssw_dex.k;
      if (weight_dex < 1 || weight_dex >= max_weight_dex)
        continue;

      if (nullptr != fonts_by_ssw[stretch_dex][slant_dex][weight_dex])
      {
        // We already found one font with he same quartet name, stretch, slant, and weight.
        // The first one wins and that's why we use two passes when substitute fonts are involved.
        continue;
      }

      ++fonts_by_ssw_count;
      fonts_by_ssw[stretch_dex][slant_dex][weight_dex] = f;

      // add this font's stretch, weight, and slant to the tally for this quartet name.
      if (1 == fonts_by_ssw_count)
      {
        stretch_dex_range[0] = stretch_dex;
        stretch_dex_range[1] = stretch_dex;
      }
      else if (stretch_dex < stretch_dex_range[0])
        stretch_dex_range[0] = stretch_dex;
      else if (stretch_dex > stretch_dex_range[1])
        stretch_dex_range[1] = stretch_dex;

      ++weight_count[stretch_dex][slant_dex];

      if (0 == slant_dex)
      {
        if (upright_face_count < 2)
          upright_faces[upright_face_count] = f;
        ++upright_face_count;
      }
      else if (1 == slant_dex)
      {
        if (slanted_face_count < 2)
          slanted_faces[slanted_face_count] = f;
        ++slanted_face_count;
      }

      // if f's role in the quartet is known, add it to the appropriate x_faces[] array.
      switch (fm)
      {
      case ON_FontFaceQuartet::Member::Regular:
        regular_faces.Append(f);
        break;
      case ON_FontFaceQuartet::Member::Bold:
        bold_faces.Append(f);
        break;
      case ON_FontFaceQuartet::Member::Italic:
        italic_faces.Append(f);
        break;
      case ON_FontFaceQuartet::Member::BoldItalic:
        bolditalic_faces.Append(f);
        break;
      case ON_FontFaceQuartet::Member::Unset:
        break;
      };
    }

    // fonts_by_ssw_count = number of usable fonts with the same quartet name.
    // Pointers to these fonts are someplace in the fonts_by_ssw[][][] array.
    if (0 == fonts_by_ssw_count)
      continue; // nothing usable

    // The goal is to look at the fonts in fonts_by_ssw[][][] and select
    // the best choice for a rich text quartet (which may have 1 to 4 faces).
    const ON_Font* quartet_faces[2][2] = {};
    bool bHaveQuartetFaces = false;

    const unsigned regular_count = regular_faces.UnsignedCount();
    const unsigned bold_count = bold_faces.UnsignedCount();
    const unsigned italic_count = italic_faces.UnsignedCount();
    const unsigned bolditalic_count = bolditalic_faces.UnsignedCount();
    if (
      fonts_by_ssw_count == (regular_count + bold_count + italic_count + bolditalic_count)
      && regular_count <= 1 && bold_count <= 1 && italic_count <= 1 && bolditalic_count <= 1)
    {
      // Best case - every font with this quartet name knows the role it plays in the quartet and there are no contradictions.
      quartet_faces[0][0] = 1 == regular_count ? regular_faces[0] : nullptr;
      quartet_faces[0][1] = 1 == bold_count ? bold_faces[0] : nullptr;
      quartet_faces[1][0] = 1 == italic_count ? italic_faces[0] : nullptr;
      quartet_faces[1][1] = 1 == bolditalic_count ? bolditalic_faces[0] : nullptr;
      bHaveQuartetFaces = true;
    }
    else if (fonts_by_ssw_count == upright_face_count + slanted_face_count
      && upright_face_count <= 2
      && slanted_face_count <= 2
      && stretch_dex_range[0] == stretch_dex_range[1]
      )
    {
      if (2 == upright_face_count && ON_Font::CompareWeight(upright_faces[0]->FontWeight(), upright_faces[1]->FontWeight()) > 0)
      {
        f = upright_faces[0];
        upright_faces[0] = upright_faces[1];
        upright_faces[1] = f;
      }
      if (2 == slanted_face_count && ON_Font::CompareWeight(slanted_faces[0]->FontWeight(), slanted_faces[1]->FontWeight()) > 0)
      {
        f = slanted_faces[0];
        slanted_faces[0] = slanted_faces[1];
        slanted_faces[1] = f;
      }
      quartet_faces[0][0] = upright_faces[0];
      quartet_faces[0][1] = upright_faces[1];
      quartet_faces[1][0] = slanted_faces[0];
      quartet_faces[1][1] = slanted_faces[1];
      bHaveQuartetFaces = true;
    }

    if (false == bHaveQuartetFaces)
    {
      // 1. Most Windows installed fonts have the Windows LOGFONT name reliably set
      // from Windows LOGFONT information when we create installed ON_Fonts from 
      // DirectWrite fonts in opennurbs_win_dwrite.cpp. The Windows LOGFONTs partition
      // families into quartets. These end up with bUsePairCandidate = true.
      // 
      // 2. In rare cases on Windows, font foundaries or authors fail to specify a LOGFONT name
      // in the ttc / ttf / postscript / ... file. 
      // If we are able to make a reasonable guess, then we set the member here.
      // 
      // 3. Apple installed fonts are created from CTFont in opennurbs_apple_nsfont.cpp
      // and the LOGFONT information from ttc / ttf / postscript files cannot be retrieved.
      // There are no Mac OS tools that reliably paritition large font families into
      // quartets.
      // 
      // 4. Missing fonts that are created in ON_Font::FontFromRichTextProperties() have the quartet
      // member set to the specified rich text regular/bold/italic/bold-italic property.
      //
      // Attempt to find something usable in this mess ...

      unsigned stretch_dex = medium_stretch_dex;
      if (stretch_dex_range[0] < stretch_dex_range[1])
      {
        // Need to pick the stretch_dex with the most members.
        // This happens on Mac OS (where no reliable "LOGFONT" name exists) and
        // with damaged Windows fonts that don't have a "LOFGONT" name set.
        // Pick the one closest to ON_Font::Stretch::Medium with the most faces        
        for (unsigned k = 1; k <= medium_stretch_dex; ++k)
        {
          const unsigned k0 = medium_stretch_dex - k;
          const unsigned k1 = medium_stretch_dex + k;
          if (k0 > 0 && (weight_count[k0][0] + weight_count[k0][1]) > (weight_count[stretch_dex][0] + weight_count[stretch_dex][1]))
            stretch_dex = k0;
          if (k1 < max_stretch_dex && (weight_count[k1][0] + weight_count[k1][1]) >(weight_count[stretch_dex][0] + weight_count[stretch_dex][1]))
            stretch_dex = k1;
        }
      }
      else
      {
        stretch_dex = stretch_dex_range[0];
      }
      if (stretch_dex < 1 || stretch_dex >= max_stretch_dex)
        continue;

      if (weight_count[stretch_dex][0] + weight_count[stretch_dex][1] <= 0)
        continue;

      const unsigned normal_weight_dex = (unsigned)static_cast<unsigned char>(ON_Font::Weight::Normal);
      const unsigned medium_weight_dex = (unsigned)static_cast<unsigned char>(ON_Font::Weight::Medium);
      const unsigned bold_weight_dex = (unsigned)static_cast<unsigned char>(ON_Font::Weight::Bold);

      for (unsigned slant_dex = 0; slant_dex < 2; slant_dex++)
      {
        if (weight_count[stretch_dex][slant_dex] <= 2)
        {
          // 0, 1 or 2 available weights.
          // If there is 1 face it must be the "Regular" face.
          // If there are 2 faces, the lightest will be "Regular" and the heaviest will be bold.
          int pair_dex = 0;
          for (int j = 1; j < max_weight_dex && pair_dex < 2; ++j)
          {
            if (nullptr != fonts_by_ssw[stretch_dex][slant_dex][j])
              quartet_faces[slant_dex][pair_dex++] = fonts_by_ssw[stretch_dex][slant_dex][j];
          }
          continue;
        }

        // 3 or more available weights (Bahnshrift, Helvetica Neue, ...)
        unsigned regular_dex
          = (nullptr != fonts_by_ssw[stretch_dex][slant_dex][normal_weight_dex])
          ? normal_weight_dex
          : medium_weight_dex;
        while (nullptr == fonts_by_ssw[stretch_dex][slant_dex][regular_dex] && regular_dex > 0)
          --regular_dex;

        unsigned bold_dex
          = (nullptr != fonts_by_ssw[stretch_dex][slant_dex][bold_weight_dex])
          ? bold_weight_dex
          : regular_dex + 1;
        while (nullptr == fonts_by_ssw[stretch_dex][slant_dex][bold_dex] && bold_dex < max_weight_dex)
          ++bold_dex;

        if (nullptr != fonts_by_ssw[stretch_dex][slant_dex][regular_dex] && nullptr == fonts_by_ssw[stretch_dex][slant_dex][bold_dex])
        {
          if (regular_dex > 0)
          {
            for (unsigned j = regular_dex - 1; j > 0; --j)
            {
              if (nullptr == fonts_by_ssw[stretch_dex][slant_dex][j])
                continue;
              bold_dex = regular_dex;
              regular_dex = j;
              break;
            }
          }
        }
        else if (nullptr == fonts_by_ssw[stretch_dex][slant_dex][regular_dex] && nullptr != fonts_by_ssw[stretch_dex][slant_dex][bold_dex])
        {
          if (bold_dex > 0)
          {
            for (unsigned j = bold_dex - 1; j > 0; --j)
            {
              if (nullptr == fonts_by_ssw[stretch_dex][slant_dex][j])
                continue;
              regular_dex = j;
              break;
            }
          }
        }

        quartet_faces[slant_dex][0] = fonts_by_ssw[stretch_dex][slant_dex][regular_dex];
        quartet_faces[slant_dex][1] = fonts_by_ssw[stretch_dex][slant_dex][bold_dex];
      }
    }

    if (nullptr == quartet_faces[0][0] && nullptr == quartet_faces[0][1])
    {
      // Fonts like Monotype Corsiva have only slanted faces.
      // A quartet name + regular/bold/italic/italic-bold user interface should offer
      // a regular and bold member in this situation.
      quartet_faces[0][0] = quartet_faces[1][0];
      quartet_faces[0][1] = quartet_faces[1][1];
      quartet_faces[1][0] = nullptr;
      quartet_faces[1][1] = nullptr;
    }

    if (nullptr == quartet_faces[0][0] && nullptr == quartet_faces[1][0])
    {
      // This might happen if buggy code encounters a heavy font like Arial Black
      // and incorrectly specifies the heavy regular/italic faces as bold.
      // A quartet name + regular/bold/italic/italic-bold user interface should offer
      // a regular and italic member in this situation.
      quartet_faces[0][0] = quartet_faces[0][1];
      quartet_faces[1][0] = quartet_faces[1][1];
      quartet_faces[0][1] = nullptr;
      quartet_faces[1][1] = nullptr;
    }

    // If ON_Font.m_quartet_member is not set or set incorrectly, 
    // then set it now so we get consistent answers going forward.
    // (Managed quartets are recomputed as new missing fonts are added and in complex cases, the quartet member can change).
    // Installed font quartet members are set once and never change.
    const ON_FontFaceQuartet::Member member[2][2] = {
      {ON_FontFaceQuartet::Member::Regular,ON_FontFaceQuartet::Member::Bold},
      {ON_FontFaceQuartet::Member::Italic,ON_FontFaceQuartet::Member::BoldItalic}
    };
    for (int ii = 0; ii < 2; ++ii) for (int jj = 0; jj < 2; ++jj)
    {
      f = quartet_faces[ii][jj];
      if (nullptr != f)
      {
        const ON_FontFaceQuartet::Member m = f->m_quartet_member;
        if (ON_FontFaceQuartet::Member::Unset == m)
          f->m_quartet_member = member[ii][jj];
        else if (m != member[ii][jj])
        {
          if (ON_Font::FontType::InstalledFont != f->m_font_type)
            quartet_faces[ii][jj]->m_quartet_member = member[ii][jj];
        }
      }
    }

    // Unset the m_quartet_member on unsed fonts with this quartet name.
    for (unsigned j = i; j < next_i; ++j)
    {
      f = a[j];
      if (nullptr == f)
        continue;
      if (f == quartet_faces[0][0] || f == quartet_faces[0][1] || f == quartet_faces[1][0] || f == quartet_faces[1][1])
        continue;
      if (f->IsUnderlined() || f->IsStrikethrough())
        continue; // dealt with below

      const ON_FontFaceQuartet::Member fm = f->m_quartet_member;
      if (ON_FontFaceQuartet::Member::Unset == fm)
        continue;
      if (ON_Font::FontType::InstalledFont != f->m_font_type)
        continue;

      // m_quartet_member incorrectly set. 
      // If you are debugging and this is causing a problem, the bug is not here; 
      // it is in the code above that fills in quartet_faces[][].
      f->m_quartet_member = ON_FontFaceQuartet::Member::Unset;
    }

    if (decorated_fonts_count > 0)
    {
      // This for() loop copies the clean font quartet settings to decorated  (underlined and strikethrough) fonts
      for (unsigned j = i; j < next_i; ++j)
      {
        f = a[j];
        if (nullptr == f)
          continue;
        if (false == f->IsUnderlined() && false == f->IsStrikethrough())
          continue;

        // f is underlined or strikethrough - find the clean version in fonts_by_ssw[][][]
        const ON_3udex ssw_dex = Internal_StretchSlantWeightDex(max_stretch_dex, max_weight_dex, f);
        const ON_Font* cleanf = (
          ssw_dex.i >= 1 && ssw_dex.i < max_stretch_dex
          && ssw_dex.j >= 0 && ssw_dex.j < 2
          && ssw_dex.k >= 1 && ssw_dex.k < max_weight_dex
          )
          ? fonts_by_ssw[ssw_dex.i][ssw_dex.k][ssw_dex.k]
          : nullptr;
        if (nullptr != cleanf)
        {
          const ON_FontFaceQuartet::Member fm = cleanf->m_quartet_member;
          f->m_quartet_member = fm;
        }
      }
    }

    // Now convert managed to installed when that makes sense.
    for (int ii = 0; ii < 2; ++ii) for (int jj = 0; jj < 2; ++jj)
    {
      f = quartet_faces[ii][jj];
      if (nullptr == f)
        continue;
      if (ON_Font::FontType::InstalledFont == f->m_font_type)
        continue;
      if (f->IsManagedSubstitutedFont())
        continue; // common - f is a managed font that is missing from this device.

      if (false == f->IsManagedFont())
        continue; // troubling situation ...
      if (f->IsUnderlined() || f->IsStrikethrough())
        continue; // troubling situation ... 

      // There are 2 lists of fonts.
      // All installed fonts - this list is made once when an application starts.
      // Managed fonts - this list grows as an application needs fonts
      // and is used to handle missing fonts and fonts with effects like underlined and strikethrough.
      // 
      // This is a case where a managed font, like ON_Font::Default, 
      // the default engraving font, 
      // and more complicated cases that arise is rich text parsing, 
      // has an identical font that is installed.
      const ON_Font* installed_font = f->Internal_ManagedFontToInstalledFont();
      if (nullptr == installed_font)
        continue;
      if (false == installed_font->IsInstalledFont())
        continue; // bad mojo happened sometime earlier in the life of this app instance.
      if (false == quartet_name.EqualOrdinal(installed_font->QuartetName(), true))
        continue; // troubling situation ...

      // It is often the case that the installed quartet has faces not in the managed font list.
      // ON_Font::Default is a good example. 
      // If there 
      ON_FontFaceQuartet installed_font_quartet = installed_font->InstalledFontQuartet();
      if (false == quartet_name.EqualOrdinal(installed_font_quartet.QuartetName(), true))
        continue;

      if (installed_font_quartet.HasRegularFace())
        quartet_faces[0][0] = installed_font_quartet.RegularFace();
      if (installed_font_quartet.HasBoldFace())
        quartet_faces[0][1] = installed_font_quartet.BoldFace();
      if (installed_font_quartet.HasItalicFace())
        quartet_faces[1][0] = installed_font_quartet.ItalicFace();
      if (installed_font_quartet.HasBoldItalicFace())
        quartet_faces[1][1] = installed_font_quartet.BoldItalicFace();
    }

    const ON_FontFaceQuartet q(quartet_name, quartet_faces[0][0], quartet_faces[0][1], quartet_faces[1][0], quartet_faces[1][1]);
    if (q.IsEmpty())
      continue;

    m_quartet_list.Append(q);
  }

  return m_quartet_list;
}